

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void AssignmentExpression_lshifteq_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_70 [8];
  JsValue v0;
  JsValue r2;
  JsValue r1;
  JsAstAssignmentExpressionNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  (*JsNodeClassEval[**(uint **)(na + 1)])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r2.u + 8));
  JsGetValue((JsValue *)((long)&r2.u + 8),(JsValue *)((long)&v0.u + 8));
  ShiftExpression_lshift_common
            ((JsValue *)((long)&v0.u + 8),(JsAstNode *)na[1].location,context,res);
  JsPutValue((JsValue *)((long)&r2.u + 8),res,(JsValue *)local_70);
  return;
}

Assistant:

static void
AssignmentExpression_lshifteq_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstAssignmentExpressionNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstAssignmentExpressionNode *n = 
		CAST_NODE(na, JsAstAssignmentExpressionNode);
	struct JsValue r1, r2,v0;

	EVAL(n->lhs, context, &r1);
	JsGetValue( &r1, &r2);
	ShiftExpression_lshift_common(&r2, n->expr, context, res);
	JsPutValue( &r1, res,&v0);
}